

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_DRBG.c
# Opt level: O2

EverCrypt_DRBG_state_s * EverCrypt_DRBG_create_in(Spec_Hash_Definitions_hash_alg a)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint32_t *puVar3;
  EverCrypt_DRBG_state_s *pEVar4;
  state_s_tags sVar5;
  undefined7 in_register_00000039;
  
  switch((int)CONCAT71(in_register_00000039,a)) {
  case 1:
    puVar1 = (uint8_t *)calloc(0x20,1);
    puVar2 = (uint8_t *)calloc(0x20,1);
    sVar5 = '\x01';
    break;
  case 2:
    puVar1 = (uint8_t *)calloc(0x30,1);
    puVar2 = (uint8_t *)calloc(0x30,1);
    sVar5 = '\x02';
    break;
  case 3:
    puVar1 = (uint8_t *)calloc(0x40,1);
    puVar2 = (uint8_t *)calloc(0x40,1);
    sVar5 = '\x03';
    break;
  case 4:
    puVar1 = (uint8_t *)calloc(0x14,1);
    puVar2 = (uint8_t *)calloc(0x14,1);
    sVar5 = '\0';
    break;
  default:
    fprintf(_stderr,"KaRaMeL incomplete match at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_DRBG.c"
            ,0xd4);
    exit(0xfd);
  }
  puVar3 = (uint32_t *)malloc(4);
  *puVar3 = 1;
  pEVar4 = (EverCrypt_DRBG_state_s *)malloc(0x20);
  pEVar4->tag = sVar5;
  (pEVar4->field_1).case_SHA1_s.k = puVar1;
  (pEVar4->field_1).case_SHA1_s.v = puVar2;
  (pEVar4->field_1).case_SHA1_s.reseed_counter = puVar3;
  return pEVar4;
}

Assistant:

EverCrypt_DRBG_state_s *EverCrypt_DRBG_create_in(Spec_Hash_Definitions_hash_alg a)
{
  EverCrypt_DRBG_state_s st;
  switch (a)
  {
    case Spec_Hash_Definitions_SHA1:
      {
        uint8_t *k = (uint8_t *)KRML_HOST_CALLOC(20U, sizeof (uint8_t));
        uint8_t *v = (uint8_t *)KRML_HOST_CALLOC(20U, sizeof (uint8_t));
        uint32_t *ctr = (uint32_t *)KRML_HOST_MALLOC(sizeof (uint32_t));
        ctr[0U] = 1U;
        st =
          (
            (EverCrypt_DRBG_state_s){
              .tag = SHA1_s,
              { .case_SHA1_s = { .k = k, .v = v, .reseed_counter = ctr } }
            }
          );
        break;
      }
    case Spec_Hash_Definitions_SHA2_256:
      {
        uint8_t *k = (uint8_t *)KRML_HOST_CALLOC(32U, sizeof (uint8_t));
        uint8_t *v = (uint8_t *)KRML_HOST_CALLOC(32U, sizeof (uint8_t));
        uint32_t *ctr = (uint32_t *)KRML_HOST_MALLOC(sizeof (uint32_t));
        ctr[0U] = 1U;
        st =
          (
            (EverCrypt_DRBG_state_s){
              .tag = SHA2_256_s,
              { .case_SHA2_256_s = { .k = k, .v = v, .reseed_counter = ctr } }
            }
          );
        break;
      }
    case Spec_Hash_Definitions_SHA2_384:
      {
        uint8_t *k = (uint8_t *)KRML_HOST_CALLOC(48U, sizeof (uint8_t));
        uint8_t *v = (uint8_t *)KRML_HOST_CALLOC(48U, sizeof (uint8_t));
        uint32_t *ctr = (uint32_t *)KRML_HOST_MALLOC(sizeof (uint32_t));
        ctr[0U] = 1U;
        st =
          (
            (EverCrypt_DRBG_state_s){
              .tag = SHA2_384_s,
              { .case_SHA2_384_s = { .k = k, .v = v, .reseed_counter = ctr } }
            }
          );
        break;
      }
    case Spec_Hash_Definitions_SHA2_512:
      {
        uint8_t *k = (uint8_t *)KRML_HOST_CALLOC(64U, sizeof (uint8_t));
        uint8_t *v = (uint8_t *)KRML_HOST_CALLOC(64U, sizeof (uint8_t));
        uint32_t *ctr = (uint32_t *)KRML_HOST_MALLOC(sizeof (uint32_t));
        ctr[0U] = 1U;
        st =
          (
            (EverCrypt_DRBG_state_s){
              .tag = SHA2_512_s,
              { .case_SHA2_512_s = { .k = k, .v = v, .reseed_counter = ctr } }
            }
          );
        break;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
  EverCrypt_DRBG_state_s
  *buf = (EverCrypt_DRBG_state_s *)KRML_HOST_MALLOC(sizeof (EverCrypt_DRBG_state_s));
  buf[0U] = st;
  return buf;
}